

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

fid __thiscall ezexample::hash(ezexample *this,string *fstr)

{
  vw *pvVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  substring sVar4;
  char *local_38;
  long local_30;
  
  pvVar1 = this->vw_ref;
  std::__cxx11::string::string((string *)&local_38,(string *)fstr);
  sVar4.end = local_38 + local_30;
  sVar4.begin = local_38;
  uVar3 = (*pvVar1->p->hasher)(sVar4,(ulong)this->current_seed);
  uVar2 = pvVar1->parse_mask;
  std::__cxx11::string::~string((string *)&local_38);
  return (uint)uVar3 & (uint)uVar2;
}

Assistant:

inline fid hash(std::string fstr) { return VW::hash_feature(*vw_ref, fstr, current_seed); }